

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_AttachMasssol
              (ARKodeMem ark_mem,ARKMassInitFn minit,ARKMassSetupFn msetup,ARKMassMultFn mmult,
              ARKMassSolveFn msolve,ARKMassFreeFn mfree,int time_dep,
              SUNLinearSolver_Type msolve_type,void *mass_mem)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x9a4,"arkStep_AttachMasssol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    if (*(code **)((long)pvVar1 + 0x170) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x170))(ark_mem);
    }
    *(ARKMassInitFn *)((long)pvVar1 + 0x150) = minit;
    *(ARKMassSetupFn *)((long)pvVar1 + 0x158) = msetup;
    *(ARKMassMultFn *)((long)pvVar1 + 0x160) = mmult;
    *(ARKMassSolveFn *)((long)pvVar1 + 0x168) = msolve;
    *(ARKMassFreeFn *)((long)pvVar1 + 0x170) = mfree;
    *(void **)((long)pvVar1 + 0x178) = mass_mem;
    *(uint *)((long)pvVar1 + 0x180) = 2 - (uint)(time_dep == 0);
    *(SUNLinearSolver_Type *)((long)pvVar1 + 0x184) = msolve_type;
    ark_mem->step_mmult = mmult;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkStep_AttachMasssol(ARKodeMem ark_mem, ARKMassInitFn minit,
                          ARKMassSetupFn msetup, ARKMassMultFn mmult,
                          ARKMassSolveFn msolve, ARKMassFreeFn mfree,
                          sunbooleantype time_dep,
                          SUNLinearSolver_Type msolve_type, void* mass_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing mass matrix solver */
  if (step_mem->mfree != NULL) { step_mem->mfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->minit       = minit;
  step_mem->msetup      = msetup;
  step_mem->mmult       = mmult;
  step_mem->msolve      = msolve;
  step_mem->mfree       = mfree;
  step_mem->mass_mem    = mass_mem;
  step_mem->mass_type   = (time_dep) ? MASS_TIMEDEP : MASS_FIXED;
  step_mem->msolve_type = msolve_type;

  /* Attach mmult function pointer to ark_mem as well */
  ark_mem->step_mmult = mmult;

  return (ARK_SUCCESS);
}